

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSat.c
# Opt level: O3

cuddPathPair getShortest(DdNode *root,int *cost,int *support,st__table *visited)

{
  int iVar1;
  int iVar2;
  cuddPathPair cVar3;
  cuddPathPair cVar4;
  int iVar5;
  DdNode *key;
  cuddPathPair *my_pair;
  int *local_48;
  DdNode *local_40;
  cuddPathPair local_38;
  
  key = (DdNode *)((ulong)root & 0xfffffffffffffffe);
  iVar1 = st__lookup(visited,(char *)key,(char **)&local_48);
  if (iVar1 == 0) {
    if (key->index == 0x7fffffff) {
      iVar5 = 0;
      iVar1 = 1000000;
      if (zero == key) {
        iVar5 = 1000000;
        iVar1 = 0;
      }
    }
    else {
      local_40 = (key->type).kids.E;
      cVar4 = getShortest((key->type).kids.T,cost,support,visited);
      local_38 = cVar4;
      cVar3 = getShortest(local_40,cost,support,visited);
      if (cost == (int *)0x0) {
        iVar1 = 1;
      }
      else {
        iVar1 = cost[key->index];
      }
      iVar5 = iVar1 + local_38.pos;
      if (cVar3.pos <= iVar5) {
        iVar5 = cVar3.pos;
      }
      iVar1 = cVar4.neg + iVar1;
      if (cVar3.neg <= iVar1) {
        iVar1 = cVar3.neg;
      }
      if (support != (int *)0x0) {
        support[key->index] = 1;
      }
    }
    local_48 = (int *)malloc(8);
    if (local_48 == (int *)0x0) {
      iVar2 = iVar1;
      if (((ulong)root & 1) == 0) {
        iVar2 = iVar5;
        iVar5 = iVar1;
      }
      goto LAB_0080dd72;
    }
    *local_48 = iVar5;
    local_48[1] = iVar1;
    st__insert(visited,(char *)key,(char *)local_48);
  }
  iVar2 = *(int *)((long)local_48 + (ulong)(-((uint)root & 1) & 4));
  iVar5 = local_48[((ulong)root & 1) == 0];
LAB_0080dd72:
  cVar4.neg = iVar5;
  cVar4.pos = iVar2;
  return cVar4;
}

Assistant:

static cuddPathPair
getShortest(
  DdNode * root,
  int * cost,
  int * support,
  st__table * visited)
{
    cuddPathPair *my_pair, res_pair, pair_T, pair_E;
    DdNode      *my_root, *T, *E;
    int         weight;

    my_root = Cudd_Regular(root);

    if ( st__lookup(visited, (const char *)my_root, (char **)&my_pair)) {
        if (Cudd_IsComplement(root)) {
            res_pair.pos = my_pair->neg;
            res_pair.neg = my_pair->pos;
        } else {
            res_pair.pos = my_pair->pos;
            res_pair.neg = my_pair->neg;
        }
        return(res_pair);
    }

    /* In the case of a BDD the following test is equivalent to
    ** testing whether the BDD is the constant 1. This formulation,
    ** however, works for ADDs as well, by assuming the usual
    ** dichotomy of 0 and != 0.
    */
    if (cuddIsConstant(my_root)) {
        if (my_root != zero) {
            res_pair.pos = 0;
            res_pair.neg = DD_BIGGY;
        } else {
            res_pair.pos = DD_BIGGY;
            res_pair.neg = 0;
        }
    } else {
        T = cuddT(my_root);
        E = cuddE(my_root);

        pair_T = getShortest(T, cost, support, visited);
        pair_E = getShortest(E, cost, support, visited);
        weight = WEIGHT(cost, my_root->index);
        res_pair.pos = ddMin(pair_T.pos+weight, pair_E.pos);
        res_pair.neg = ddMin(pair_T.neg+weight, pair_E.neg);

        /* Update support. */
        if (support != NULL) {
            support[my_root->index] = 1;
        }
    }

    my_pair = ABC_ALLOC(cuddPathPair, 1);
    if (my_pair == NULL) {
        if (Cudd_IsComplement(root)) {
            int tmp = res_pair.pos;
            res_pair.pos = res_pair.neg;
            res_pair.neg = tmp;
        }
        return(res_pair);
    }
    my_pair->pos = res_pair.pos;
    my_pair->neg = res_pair.neg;

    st__insert(visited, (char *)my_root, (char *)my_pair);
    if (Cudd_IsComplement(root)) {
        res_pair.pos = my_pair->neg;
        res_pair.neg = my_pair->pos;
    } else {
        res_pair.pos = my_pair->pos;
        res_pair.neg = my_pair->neg;
    }
    return(res_pair);

}